

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::GetElementIIntIndex
              (Var instance,Var index,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  PropertyQueryFlags PVar4;
  int iVar5;
  undefined4 *puVar6;
  RecyclableObject *this;
  JavascriptArray *arr;
  JavascriptString *this_00;
  JavascriptNativeFloatArray *arr_00;
  JavascriptCopyOnAccessNativeIntArray *this_01;
  INT_PTR *this_02;
  JavascriptNativeIntArray *arr_01;
  Type TVar7;
  uint32 index_00;
  Var pvVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  TypedArray<double,_false,_true> *local_40;
  Var result;
  
  uVar10 = (ulong)index & 0xffff000000000000;
  bVar11 = uVar10 == 0x1000000000000;
  bVar12 = ((ulong)index & 0x1ffff00000000) != 0x1000000000000;
  result = instance;
  if (bVar12 && bVar11) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00abbfee;
    *puVar6 = 0;
  }
  if (uVar10 != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xe76,"(TaggedInt::Is(index))","TaggedInt::Is(index)");
    if (!bVar2) goto LAB_00abbfee;
    *puVar6 = 0;
  }
  if (result == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00abbfee;
    *puVar6 = 0;
  }
  uVar9 = (ulong)result & 0xffff000000000000;
  if (((ulong)result & 0x1ffff00000000) != 0x1000000000000 && uVar9 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00abbfee;
    *puVar6 = 0;
  }
  TVar7 = TypeIds_FirstNumberType;
  if ((uVar9 != 0x1000000000000) && (TVar7 = TypeIds_Number, (ulong)result >> 0x32 == 0)) {
    this = UnsafeVarTo<Js::RecyclableObject>(result);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    TVar7 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar7) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_00abbfee;
      *puVar6 = 0;
    }
  }
  pvVar8 = result;
  index_00 = (uint32)index;
  switch(TVar7) {
  case TypeIds_Array:
    arr = UnsafeVarTo<Js::JavascriptArray>(result);
    if (bVar12 && bVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                   "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    if (uVar10 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar11) {
LAB_00abbfee:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    iVar5 = OP_GetElementI_ArrayFastPath<Js::JavascriptArray>(arr,index_00,&local_40,scriptContext);
    goto LAB_00abbfcf;
  case TypeIds_NativeIntArray:
    if (result != (Var)0x0) {
      bVar2 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(result);
      if (bVar2) {
        this_01 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar8);
      }
      else {
        this_01 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
      }
      if (this_01 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_01);
      }
    }
    arr_01 = UnsafeVarTo<Js::JavascriptNativeIntArray>(pvVar8);
    if (bVar12 && bVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                   "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    if (uVar10 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    iVar5 = OP_GetElementI_ArrayFastPath<Js::JavascriptNativeIntArray>
                      (arr_01,index_00,&local_40,scriptContext);
    goto LAB_00abbfcf;
  case TypeIds_CopyOnAccessNativeIntArray:
  case TypeIds_ArrayLastWithES5:
  case TypeIds_Date:
  case TypeIds_RegEx:
  case TypeIds_Error:
  case TypeIds_BooleanObject:
  case TypeIds_NumberObject:
  case TypeIds_StringObject:
  case TypeIds_BigIntObject:
  case TypeIds_SIMDObject:
  case TypeIds_Arguments:
  case TypeIds_ArrayBuffer:
    goto switchD_00abb182_caseD_1f;
  case TypeIds_ArrayLast:
    arr_00 = UnsafeVarTo<Js::JavascriptNativeFloatArray>(result);
    if (bVar12 && bVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                   "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    if (uVar10 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    iVar5 = OP_GetElementI_ArrayFastPath<Js::JavascriptNativeFloatArray>
                      (arr_00,index_00,&local_40,scriptContext);
LAB_00abbfcf:
    pvVar8 = result;
    if (iVar5 != 0) {
      return local_40;
    }
    goto switchD_00abb182_caseD_1f;
  case TypeIds_Int8Array:
    if (bVar12 && bVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                   "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    if (uVar10 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    pvVar8 = result;
    this_02 = &VirtualTableInfo<Js::TypedArray<char,_false,_true>_>::Address;
    if (*result == VirtualTableInfo<Js::TypedArray<char,_false,_true>_>::Address) {
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<char,false,true>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<char,_false,_true>::DirectGetItem
                            ((TypedArray<char,_false,_true> *)this_02,index_00);
      }
      break;
    }
    if (*result == VirtualTableInfo<Js::TypedArray<char,_false,_false>_>::Address) {
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<char,false,false>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<char,_false,_false>::DirectGetItem
                            ((TypedArray<char,_false,_false> *)this_02,index_00);
      }
      break;
    }
    goto LAB_00abbec9;
  case TypeIds_Uint8Array:
    if (bVar12 && bVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                   "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    if (uVar10 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    pvVar8 = result;
    this_02 = &VirtualTableInfo<Js::TypedArray<unsigned_char,_false,_true>_>::Address;
    if (*result == VirtualTableInfo<Js::TypedArray<unsigned_char,_false,_true>_>::Address) {
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<unsigned_char,false,true>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<unsigned_char,_false,_true>::DirectGetItem
                            ((TypedArray<unsigned_char,_false,_true> *)this_02,index_00);
      }
    }
    else {
      if (*result != VirtualTableInfo<Js::TypedArray<unsigned_char,_false,_false>_>::Address)
      goto LAB_00abbec9;
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<unsigned_char,false,false>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<unsigned_char,_false,_false>::DirectGetItem
                            ((TypedArray<unsigned_char,_false,_false> *)this_02,index_00);
      }
    }
    break;
  case TypeIds_Uint8ClampedArray:
    if (bVar12 && bVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                   "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    if (uVar10 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    pvVar8 = result;
    this_02 = &VirtualTableInfo<Js::TypedArray<unsigned_char,_true,_true>_>::Address;
    if (*result == VirtualTableInfo<Js::TypedArray<unsigned_char,_true,_true>_>::Address) {
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<unsigned_char,true,true>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<unsigned_char,_true,_true>::DirectGetItem
                            ((TypedArray<unsigned_char,_true,_true> *)this_02,index_00);
      }
    }
    else {
      if (*result != VirtualTableInfo<Js::TypedArray<unsigned_char,_true,_false>_>::Address)
      goto LAB_00abbec9;
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<unsigned_char,true,false>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<unsigned_char,_true,_false>::DirectGetItem
                            ((TypedArray<unsigned_char,_true,_false> *)this_02,index_00);
      }
    }
    break;
  case TypeIds_Int16Array:
    if (bVar12 && bVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                   "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    if (uVar10 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    pvVar8 = result;
    this_02 = &VirtualTableInfo<Js::TypedArray<short,_false,_true>_>::Address;
    if (*result == VirtualTableInfo<Js::TypedArray<short,_false,_true>_>::Address) {
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<short,false,true>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<short,_false,_true>::DirectGetItem
                            ((TypedArray<short,_false,_true> *)this_02,index_00);
      }
    }
    else {
      if (*result != VirtualTableInfo<Js::TypedArray<short,_false,_false>_>::Address)
      goto LAB_00abbec9;
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<short,false,false>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<short,_false,_false>::DirectGetItem
                            ((TypedArray<short,_false,_false> *)this_02,index_00);
      }
    }
    break;
  case TypeIds_Uint16Array:
    if (bVar12 && bVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                   "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    if (uVar10 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    pvVar8 = result;
    this_02 = &VirtualTableInfo<Js::TypedArray<unsigned_short,_false,_true>_>::Address;
    if (*result == VirtualTableInfo<Js::TypedArray<unsigned_short,_false,_true>_>::Address) {
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<unsigned_short,false,true>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<unsigned_short,_false,_true>::DirectGetItem
                            ((TypedArray<unsigned_short,_false,_true> *)this_02,index_00);
      }
    }
    else {
      if (*result != VirtualTableInfo<Js::TypedArray<unsigned_short,_false,_false>_>::Address)
      goto LAB_00abbec9;
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<unsigned_short,false,false>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<unsigned_short,_false,_false>::DirectGetItem
                            ((TypedArray<unsigned_short,_false,_false> *)this_02,index_00);
      }
    }
    break;
  case TypeIds_Int32Array:
    if (bVar12 && bVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                   "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    if (uVar10 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    pvVar8 = result;
    this_02 = &VirtualTableInfo<Js::TypedArray<int,_false,_true>_>::Address;
    if (*result == VirtualTableInfo<Js::TypedArray<int,_false,_true>_>::Address) {
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<int,false,true>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<int,_false,_true>::DirectGetItem
                            ((TypedArray<int,_false,_true> *)this_02,index_00);
      }
    }
    else {
      if (*result != VirtualTableInfo<Js::TypedArray<int,_false,_false>_>::Address)
      goto LAB_00abbec9;
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<int,false,false>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<int,_false,_false>::DirectGetItem
                            ((TypedArray<int,_false,_false> *)this_02,index_00);
      }
    }
    break;
  case TypeIds_Uint32Array:
    if (bVar12 && bVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                   "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    if (uVar10 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    pvVar8 = result;
    this_02 = &VirtualTableInfo<Js::TypedArray<unsigned_int,_false,_true>_>::Address;
    if (*result == VirtualTableInfo<Js::TypedArray<unsigned_int,_false,_true>_>::Address) {
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<unsigned_int,false,true>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<unsigned_int,_false,_true>::DirectGetItem
                            ((TypedArray<unsigned_int,_false,_true> *)this_02,index_00);
      }
    }
    else {
      if (*result != VirtualTableInfo<Js::TypedArray<unsigned_int,_false,_false>_>::Address)
      goto LAB_00abbec9;
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<unsigned_int,false,false>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<unsigned_int,_false,_false>::DirectGetItem
                            ((TypedArray<unsigned_int,_false,_false> *)this_02,index_00);
      }
    }
    break;
  case TypeIds_Float32Array:
    if (bVar12 && bVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                   "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    if (uVar10 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    pvVar8 = result;
    this_02 = &VirtualTableInfo<Js::TypedArray<float,_false,_true>_>::Address;
    if (*result == VirtualTableInfo<Js::TypedArray<float,_false,_true>_>::Address) {
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<float,false,true>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<float,_false,_true>::DirectGetItem
                            ((TypedArray<float,_false,_true> *)this_02,index_00);
      }
    }
    else {
      if (*result != VirtualTableInfo<Js::TypedArray<float,_false,_false>_>::Address)
      goto LAB_00abbec9;
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<float,false,false>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<float,_false,_false>::DirectGetItem
                            ((TypedArray<float,_false,_false> *)this_02,index_00);
      }
    }
    break;
  case TypeIds_Float64Array:
    if (bVar12 && bVar11) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                   "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    if (uVar10 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                   ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar11) goto LAB_00abbfee;
      *puVar6 = 0;
    }
    pvVar8 = result;
    this_02 = &VirtualTableInfo<Js::TypedArray<double,_false,_true>_>::Address;
    if (*result == VirtualTableInfo<Js::TypedArray<double,_false,_true>_>::Address) {
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<double,false,true>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<double,_false,_true>::DirectGetItem
                            ((TypedArray<double,_false,_true> *)this_02,index_00);
      }
    }
    else {
      if (*result != VirtualTableInfo<Js::TypedArray<double,_false,_false>_>::Address)
      goto LAB_00abbec9;
      this_02 = (INT_PTR *)UnsafeVarTo<Js::TypedArray<double,false,false>>(result);
      if (-1 < (int)index_00) {
        this_02 = (INT_PTR *)
                  TypedArray<double,_false,_false>::DirectGetItem
                            ((TypedArray<double,_false,_false> *)this_02,index_00);
      }
    }
    break;
  default:
    if (TVar7 == TypeIds_String) {
      if (bVar12 && bVar11) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                     ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                     "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar11) goto LAB_00abbfee;
        *puVar6 = 0;
      }
      if (uVar10 != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                     ,0x51,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
        if (!bVar11) goto LAB_00abbfee;
        *puVar6 = 0;
      }
      pvVar8 = result;
      this_00 = UnsafeVarTo<Js::JavascriptString>(result);
      PVar4 = JavascriptString::GetItemQuery(this_00,pvVar8,index_00,&local_40,scriptContext);
      if (PVar4 == Property_Found) {
        return local_40;
      }
    }
    goto switchD_00abb182_caseD_1f;
  }
  bVar11 = true;
  if ((int)index_00 < 0) {
LAB_00abbec9:
    bVar11 = false;
  }
  if (!bVar11) {
switchD_00abb182_caseD_1f:
    this_02 = (INT_PTR *)GetElementIHelper(pvVar8,index,pvVar8,scriptContext);
  }
  return this_02;
}

Assistant:

Var JavascriptOperators::GetElementIIntIndex(_In_ Var instance, _In_ Var index, _In_ ScriptContext* scriptContext)
    {
        Assert(TaggedInt::Is(index));

        switch (JavascriptOperators::GetTypeId(instance))
        {
        case TypeIds_Array: //fast path for array
        {
            Var result;
            if (OP_GetElementI_ArrayFastPath(UnsafeVarTo<JavascriptArray>(instance), TaggedInt::ToInt32(index), &result, scriptContext))
            {
                return result;
            }
            break;
        }
        case TypeIds_NativeIntArray:
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
            Var result;
            if (OP_GetElementI_ArrayFastPath(UnsafeVarTo<JavascriptNativeIntArray>(instance), TaggedInt::ToInt32(index), &result, scriptContext))
            {
                return result;
            }
            break;
        }
        case TypeIds_NativeFloatArray:
        {
            Var result;
            if (OP_GetElementI_ArrayFastPath(UnsafeVarTo<JavascriptNativeFloatArray>(instance), TaggedInt::ToInt32(index), &result, scriptContext))
            {
                return result;
            }
            break;
        }

        case TypeIds_String: // fast path for string
        {
            charcount_t indexInt = TaggedInt::ToUInt32(index);
            JavascriptString* string = UnsafeVarTo<JavascriptString>(instance);
            Var result;
            if (JavascriptConversion::PropertyQueryFlagsToBoolean(string->JavascriptString::GetItemQuery(instance, indexInt, &result, scriptContext)))
            {
                return result;
            }
            break;
        }

        case TypeIds_Int8Array:
        {
            // The typed array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Int8VirtualArray>::HasVirtualTable(instance))
            {
                Int8VirtualArray* int8Array = UnsafeVarTo<Int8VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return int8Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Int8Array>::HasVirtualTable(instance))
            {
                Int8Array* int8Array = UnsafeVarTo<Int8Array>(instance);
                if (indexInt >= 0)
                {
                    return int8Array->DirectGetItem(indexInt);
                }
            }
            break;
        }

        case TypeIds_Uint8Array:
        {
            // The typed array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Uint8VirtualArray>::HasVirtualTable(instance))
            {
                Uint8VirtualArray* uint8Array = UnsafeVarTo<Uint8VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return uint8Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Uint8Array>::HasVirtualTable(instance))
            {
                Uint8Array* uint8Array = UnsafeVarTo<Uint8Array>(instance);
                if (indexInt >= 0)
                {
                    return uint8Array->DirectGetItem(indexInt);
                }
            }
            break;
        }

        case TypeIds_Uint8ClampedArray:
        {
            // The typed array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Uint8ClampedVirtualArray>::HasVirtualTable(instance))
            {
                Uint8ClampedVirtualArray* uint8ClampedArray = UnsafeVarTo<Uint8ClampedVirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return uint8ClampedArray->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Uint8ClampedArray>::HasVirtualTable(instance))
            {
                Uint8ClampedArray* uint8ClampedArray = UnsafeVarTo<Uint8ClampedArray>(instance);
                if (indexInt >= 0)
                {
                    return uint8ClampedArray->DirectGetItem(indexInt);
                }
            }
            break;
        }

        case TypeIds_Int16Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);

            if (VirtualTableInfo<Int16VirtualArray>::HasVirtualTable(instance))
            {
                Int16VirtualArray* int16Array = UnsafeVarTo<Int16VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return int16Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Int16Array>::HasVirtualTable(instance))
            {
                Int16Array* int16Array = UnsafeVarTo<Int16Array>(instance);
                if (indexInt >= 0)
                {
                    return int16Array->DirectGetItem(indexInt);
                }
            }
            break;
        }

        case TypeIds_Uint16Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);

            if (VirtualTableInfo<Uint16VirtualArray>::HasVirtualTable(instance))
            {
                Uint16VirtualArray* uint16Array = UnsafeVarTo<Uint16VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return uint16Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Uint16Array>::HasVirtualTable(instance))
            {
                Uint16Array* uint16Array = UnsafeVarTo<Uint16Array>(instance);
                if (indexInt >= 0)
                {
                    return uint16Array->DirectGetItem(indexInt);
                }
            }
            break;
        }
        case TypeIds_Int32Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Int32VirtualArray>::HasVirtualTable(instance))
            {
                Int32VirtualArray* int32Array = UnsafeVarTo<Int32VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return int32Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Int32Array>::HasVirtualTable(instance))
            {
                Int32Array* int32Array = UnsafeVarTo<Int32Array>(instance);
                if (indexInt >= 0)
                {
                    return int32Array->DirectGetItem(indexInt);
                }
            }
            break;

        }
        case TypeIds_Uint32Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Uint32VirtualArray>::HasVirtualTable(instance))
            {
                Uint32VirtualArray* uint32Array = UnsafeVarTo<Uint32VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return uint32Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Uint32Array>::HasVirtualTable(instance))
            {
                Uint32Array* uint32Array = UnsafeVarTo<Uint32Array>(instance);
                if (indexInt >= 0)
                {
                    return uint32Array->DirectGetItem(indexInt);
                }
            }
            break;
        }
        case TypeIds_Float32Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);

            if (VirtualTableInfo<Float32VirtualArray>::HasVirtualTable(instance))
            {
                Float32VirtualArray* float32Array = UnsafeVarTo<Float32VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return float32Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Float32Array>::HasVirtualTable(instance))
            {
                Float32Array* float32Array = UnsafeVarTo<Float32Array>(instance);
                if (indexInt >= 0)
                {
                    return float32Array->DirectGetItem(indexInt);
                }
            }
            break;
        }
        case TypeIds_Float64Array:
        {
            // The type array will deal with all possible values for the index
            int32 indexInt = TaggedInt::ToInt32(index);
            if (VirtualTableInfo<Float64VirtualArray>::HasVirtualTable(instance))
            {
                Float64VirtualArray* float64Array = UnsafeVarTo<Float64VirtualArray>(instance);
                if (indexInt >= 0)
                {
                    return float64Array->DirectGetItem(indexInt);
                }
            }
            else if (VirtualTableInfo<Float64Array>::HasVirtualTable(instance))
            {
                Float64Array* float64Array = UnsafeVarTo<Float64Array>(instance);
                if (indexInt >= 0)
                {
                    return float64Array->DirectGetItem(indexInt);
                }
            }
            break;
        }

        default:
            break;
        }
        return JavascriptOperators::GetElementIHelper(instance, index, instance, scriptContext);
    }